

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

void lysc_unres_dflt_free(ly_ctx *ctx,lysc_unres_dflt *r)

{
  ulong local_30;
  ulong local_20;
  uint64_t c__;
  lysc_unres_dflt *r_local;
  ly_ctx *ctx_local;
  
  if ((r->dflt != (lysp_qname *)0x0) && (r->dflts != (lysp_qname *)0x0)) {
    __assert_fail("!r->dflt || !r->dflts",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0xd1,"void lysc_unres_dflt_free(const struct ly_ctx *, struct lysc_unres_dflt *)"
                 );
  }
  if (r->dflt == (lysp_qname *)0x0) {
    local_20 = 0;
    while( true ) {
      if (r->dflts == (lysp_qname *)0x0) {
        local_30 = 0;
      }
      else {
        local_30 = *(ulong *)&r->dflts[-1].flags;
      }
      if (local_30 <= local_20) break;
      lysp_qname_free(ctx,r->dflts + local_20);
      local_20 = local_20 + 1;
    }
    if (r->dflts != (lysp_qname *)0x0) {
      free(&r->dflts[-1].flags);
    }
  }
  else {
    lysp_qname_free(ctx,r->dflt);
    free(r->dflt);
  }
  free(r);
  return;
}

Assistant:

static void
lysc_unres_dflt_free(const struct ly_ctx *ctx, struct lysc_unres_dflt *r)
{
    assert(!r->dflt || !r->dflts);
    if (r->dflt) {
        lysp_qname_free((struct ly_ctx *)ctx, r->dflt);
        free(r->dflt);
    } else {
        FREE_ARRAY((struct ly_ctx *)ctx, r->dflts, lysp_qname_free);
    }
    free(r);
}